

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Number __thiscall LiteScript::Number::operator*(Number *this,Number *number)

{
  Number *in_RDX;
  float fVar1;
  float fVar2;
  Number *number_local;
  Number *this_local;
  
  if ((number->numeric_type == '\0') && (in_RDX->numeric_type == '\0')) {
    Number(this,(number->value).integer * (in_RDX->value).integer);
  }
  else {
    fVar1 = operator_cast_to_float(number);
    fVar2 = operator_cast_to_float(in_RDX);
    Number(this,fVar1 * fVar2);
  }
  return (Number)this;
}

Assistant:

LiteScript::Number LiteScript::Number::operator*(const LiteScript::Number& number) const {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        return Number(this->value.integer * number.value.integer);
    else
        return Number((float)*this * (float)number);
}